

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int ac,char **av)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_109;
  string local_108;
  Core c;
  
  if (ac == 2) {
    Core::Core(&c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,av[1],&local_109);
    bVar1 = Core::run(&c,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    iVar2 = 0x54;
    if (bVar1) {
      iVar2 = 0;
    }
    Core::~Core(&c);
  }
  else {
    iVar2 = 0x54;
  }
  return iVar2;
}

Assistant:

int main(int ac, char **av)
{
    if (ac != 2)
        return 84;

    Core c;

    if (!c.run(av[1]))
        return 84;

    return 0;
}